

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O1

void __thiscall ANN::add_layer(ANN *this,uint n_layer,initializer_list<unsigned_int> *n_perceptrons)

{
  ulong uVar1;
  Layer layer;
  Layer local_88;
  
  if (n_layer != 0) {
    uVar1 = 0;
    do {
      local_88.m_biases.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.m_biases.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.m_biases.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.m_weights.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.m_weights.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.m_perceptrons.super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.m_weights.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.m_perceptrons.super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.m_perceptrons.super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Layer::add_perceptron(&local_88,n_perceptrons->_M_array[uVar1]);
      std::vector<Layer,_std::allocator<Layer>_>::push_back(&this->m_layers,&local_88);
      Layer::~Layer(&local_88);
      uVar1 = uVar1 + 1;
    } while (n_layer != uVar1);
  }
  return;
}

Assistant:

void ANN::add_layer(uint n_layer, const std::initializer_list<uint>& n_perceptrons){
    for(uint i=0;i<n_layer;++i){
    Layer layer;
    layer.add_perceptron(*(n_perceptrons.begin()+i));
    m_layers.push_back(layer);
    }
}